

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall
FileReaderLZMA::FileReaderLZMA
          (FileReaderLZMA *this,FileReader *file,size_t uncompressed_size,bool zip)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  CLzmaDec *p;
  undefined7 in_register_00000009;
  BYTE header [9];
  
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderLZMA_006ef1c0;
  this->File = file;
  this->SawEOF = false;
  if ((int)CONCAT71(in_register_00000009,zip) != 0) {
    this->Size = uncompressed_size;
    this->OutProcessed = 0;
    iVar1 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,header,9);
    if (CONCAT44(extraout_var,iVar1) < 9) {
      I_Error("FileReaderLZMA: File too shart\n");
    }
    if (header._2_2_ != 5) {
      I_Error("FileReaderLZMA: LZMA props size is %d (expected %d)\n",(ulong)(ushort)header._2_2_,5)
      ;
    }
    FillBuffer(this);
    p = (CLzmaDec *)operator_new(0x88);
    this->Streamp = (StreamPointer *)p;
    p->probs = (UInt16 *)0x0;
    p->dic = (Byte *)0x0;
    uVar2 = LzmaDec_Allocate(p,header + 4,5,&g_Alloc);
    if (uVar2 != 0) {
      I_Error("FileReaderLZMA: LzmaDec_Allocate failed: %d\n",(ulong)uVar2);
    }
    LzmaDec_Init(&this->Streamp->Stream);
    return;
  }
  __assert_fail("zip == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/files.cpp"
                ,0x18e,"FileReaderLZMA::FileReaderLZMA(FileReader &, size_t, bool)");
}

Assistant:

FileReaderLZMA::FileReaderLZMA (FileReader &file, size_t uncompressed_size, bool zip)
: File(file), SawEOF(false)
{
	BYTE header[4 + LZMA_PROPS_SIZE];
	int err;

	assert(zip == true);

	Size = uncompressed_size;
	OutProcessed = 0;

	// Read zip LZMA properties header
	if (File.Read(header, sizeof(header)) < (long)sizeof(header))
	{
		I_Error("FileReaderLZMA: File too shart\n");
	}
	if (header[2] + header[3] * 256 != LZMA_PROPS_SIZE)
	{
		I_Error("FileReaderLZMA: LZMA props size is %d (expected %d)\n",
			header[2] + header[3] * 256, LZMA_PROPS_SIZE);
	}

	FillBuffer();

	Streamp = new StreamPointer;
	LzmaDec_Construct(&Streamp->Stream);
	err = LzmaDec_Allocate(&Streamp->Stream, header + 4, LZMA_PROPS_SIZE, &g_Alloc);

	if (err != SZ_OK)
	{
		I_Error("FileReaderLZMA: LzmaDec_Allocate failed: %d\n", err);
	}

	LzmaDec_Init(&Streamp->Stream);
}